

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

QSet<QSpanCollection::Span_*> __thiscall
QSpanCollection::spansInRect(QSpanCollection *this,int x,int y,int w,int h)

{
  _Rb_tree_color _Var1;
  long lVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  undefined4 in_register_00000034;
  int in_R9D;
  long in_FS_OFFSET;
  bool bVar7;
  QHashDummyValue local_41;
  _Base_ptr local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->spans).super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  lVar2 = *(long *)(CONCAT44(in_register_00000034,x) + 0x18);
  if (lVar2 == 0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var5 = *(_Rb_tree_node_base **)(lVar2 + 0x18);
    p_Var4 = (_Rb_tree_node_base *)(lVar2 + 0x10);
    if (p_Var5 != (_Rb_tree_node_base *)0x0) {
      do {
        _Var1 = p_Var5[1]._M_color;
        bVar7 = (int)(_Var1 + w) < 0;
        if (SBORROW4(_Var1,-w) == bVar7) {
          p_Var4 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[SBORROW4(_Var1,-w) != bVar7];
      } while (p_Var5 != (_Base_ptr)0x0);
    }
  }
  p_Var5 = (_Rb_tree_node_base *)(lVar2 + 0x10);
  if (lVar2 == 0) {
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var4 == p_Var5) {
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var4);
  }
  while (SBORROW4(in_R9D + w,-p_Var4[1]._M_color) == (int)(in_R9D + w + p_Var4[1]._M_color) < 0) {
    p_Var3 = p_Var4[1]._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var5 = (_Rb_tree_node_base *)&p_Var3->_M_left;
      for (p_Var6 = p_Var3->_M_right; p_Var6 != (_Rb_tree_node_base *)0x0;
          p_Var6 = (&p_Var6->_M_left)[SBORROW4(_Var1,-y) != bVar7]) {
        _Var1 = p_Var6[1]._M_color;
        bVar7 = (int)(_Var1 + y) < 0;
        if (SBORROW4(_Var1,-y) == bVar7) {
          p_Var5 = p_Var6;
        }
      }
    }
    p_Var6 = (_Rb_tree_node_base *)&p_Var3->_M_left;
    if (p_Var3 == (_Base_ptr)0x0) {
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var5 == p_Var6) {
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
    }
    while (SBORROW4(h + y,-p_Var5[1]._M_color) == (int)(h + y + p_Var5[1]._M_color) < 0) {
      p_Var3 = p_Var5[1]._M_parent;
      if ((w <= *(int *)&p_Var3->_M_parent) && (y <= *(int *)((long)&p_Var3->_M_parent + 4))) {
        local_40 = p_Var3;
        QHash<QSpanCollection::Span*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QSpanCollection::Span*,QHashDummyValue> *)this,(Span **)&local_40,
                   &local_41);
      }
      if (p_Var4[1]._M_parent == (_Base_ptr)0x0) {
        p_Var6 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var6 = *(_Rb_tree_node_base **)(p_Var4[1]._M_parent + 1);
      }
      if (p_Var5 == p_Var6) break;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
    }
    lVar2 = *(long *)(CONCAT44(in_register_00000034,x) + 0x18);
    if (lVar2 == 0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var5 = *(_Rb_tree_node_base **)(lVar2 + 0x20);
    }
    if (p_Var4 == p_Var5) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSet<QSpanCollection::Span_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QSpanCollection::Span *> QSpanCollection::spansInRect(int x, int y, int w, int h) const
{
    QSet<Span *> list;
    Index::const_iterator it_y = index.lowerBound(-y);
    if (it_y == index.end())
        --it_y;
    while(-it_y.key() <= y + h) {
        SubIndex::const_iterator it_x = (*it_y).lowerBound(-x);
        if (it_x == (*it_y).end())
            --it_x;
        while(-it_x.key() <= x + w) {
            Span *s = *it_x;
            if (s->bottom() >= y && s->right() >= x)
                list << s;
            if (it_x == (*it_y).begin())
                break;
            --it_x;
        }
        if (it_y == index.begin())
            break;
        --it_y;
    }
    return list;
}